

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2ec4d::TestThrowingTestsAreReportedAsFailures::RunImpl
          (TestThrowingTestsAreReportedAsFailures *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  ScopedCurrentTest scopedResult;
  TestResults results;
  int local_6c;
  ScopedCurrentTest local_68;
  Test local_58;
  TestResults local_20;
  
  UnitTest::TestResults::TestResults(&local_20,(TestReporter *)0x0);
  ppTVar1 = UnitTest::CurrentTest::Results();
  local_68.m_oldTestResults = *ppTVar1;
  ppTVar2 = UnitTest::CurrentTest::Details();
  local_68.m_oldTestDetails = *ppTVar2;
  ppTVar1 = UnitTest::CurrentTest::Results();
  *ppTVar1 = &local_20;
  UnitTest::Test::Test(&local_58,"throwing","DefaultSuite","",0);
  local_58._vptr_Test = (_func_int **)&PTR__Test_00151540;
  UnitTest::Test::Run(&local_58);
  UnitTest::Test::~Test(&local_58);
  ScopedCurrentTest::~ScopedCurrentTest(&local_68);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_68.m_oldTestResults = (TestResults *)CONCAT44(local_68.m_oldTestResults._4_4_,1);
  local_6c = UnitTest::TestResults::GetFailureCount(&local_20);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_58,*ppTVar2,0x48);
  UnitTest::CheckEqual<int,int>(results_00,(int *)&local_68,&local_6c,(TestDetails *)&local_58);
  return;
}

Assistant:

TEST(ThrowingTestsAreReportedAsFailures)
{
    class CrashingTest : public Test
    {
    public:
        CrashingTest() : Test("throwing") {}
        virtual void RunImpl() const
        {
            throw "Blah";
        }
    };
 
    TestResults results;
	{
		ScopedCurrentTest scopedResult(results);
		CrashingTest().Run();
	}

	CHECK_EQUAL(1, results.GetFailureCount());
}